

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlmanager.cpp
# Opt level: O0

void __thiscall mwheel::DLManager::unload_library(DLManager *this,path *library_path)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  pointer ppVar4;
  basic_ostream<char,_std::char_traits<char>_> *pbVar5;
  ostream *poVar6;
  string *what;
  stringstream estream_1;
  char *error_message;
  stringstream estream;
  iterator it;
  string *in_stack_fffffffffffffc08;
  map<boost::filesystem::path,_void_*,_std::less<boost::filesystem::path>,_std::allocator<std::pair<const_boost::filesystem::path,_void_*>_>_>
  *in_stack_fffffffffffffc10;
  iterator in_stack_fffffffffffffc18;
  undefined7 in_stack_fffffffffffffc68;
  undefined1 in_stack_fffffffffffffc6f;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffffc70;
  stringstream local_370 [16];
  ostream local_360 [376];
  char *local_1e8;
  undefined1 local_1d9;
  stringstream local_1a8 [16];
  ostream local_198 [376];
  _Self local_20;
  _Self local_18 [3];
  
  local_18[0]._M_node =
       (_Base_ptr)
       std::
       map<boost::filesystem::path,_void_*,_std::less<boost::filesystem::path>,_std::allocator<std::pair<const_boost::filesystem::path,_void_*>_>_>
       ::find((map<boost::filesystem::path,_void_*,_std::less<boost::filesystem::path>,_std::allocator<std::pair<const_boost::filesystem::path,_void_*>_>_>
               *)in_stack_fffffffffffffc08,(key_type *)0x10f641);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<boost::filesystem::path,_void_*,_std::less<boost::filesystem::path>,_std::allocator<std::pair<const_boost::filesystem::path,_void_*>_>_>
       ::end((map<boost::filesystem::path,_void_*,_std::less<boost::filesystem::path>,_std::allocator<std::pair<const_boost::filesystem::path,_void_*>_>_>
              *)in_stack_fffffffffffffc08);
  bVar1 = std::operator==(local_18,&local_20);
  if (bVar1) {
    std::__cxx11::stringstream::stringstream(local_1a8);
    std::operator<<(local_198,
                    "ERROR : cannot trying to unload a shared library that was not previously loaded "
                   );
    pbVar5 = boost::filesystem::operator<<
                       (in_stack_fffffffffffffc70,
                        (path *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68));
    std::ostream::operator<<((ostream *)pbVar5,std::endl<char,std::char_traits<char>>);
    poVar6 = std::operator<<(local_198,"\tDid you use a wrong name for the library to be unloaded?")
    ;
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    local_1d9 = 1;
    uVar3 = __cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    library_not_loaded::library_not_loaded
              ((library_not_loaded *)in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
    local_1d9 = 0;
    __cxa_throw(uVar3,&library_not_loaded::typeinfo,library_not_loaded::~library_not_loaded);
  }
  ppVar4 = std::_Rb_tree_iterator<std::pair<const_boost::filesystem::path,_void_*>_>::operator->
                     ((_Rb_tree_iterator<std::pair<const_boost::filesystem::path,_void_*>_> *)
                      0x10f7e6);
  iVar2 = dlclose(ppVar4->second);
  if (iVar2 != 0) {
    local_1e8 = (char *)dlerror();
    std::__cxx11::stringstream::stringstream(local_370);
    std::operator<<(local_360,"ERROR : cannot unload shared library ");
    pbVar5 = boost::filesystem::operator<<
                       (in_stack_fffffffffffffc70,
                        (path *)CONCAT17(in_stack_fffffffffffffc6f,in_stack_fffffffffffffc68));
    std::ostream::operator<<((ostream *)pbVar5,std::endl<char,std::char_traits<char>>);
    poVar6 = std::operator<<(local_360,"\t");
    poVar6 = std::operator<<(poVar6,local_1e8);
    std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    what = (string *)__cxa_allocate_exception(0x10);
    std::__cxx11::stringstream::str();
    error_unloading_dynamic_library::error_unloading_dynamic_library
              ((error_unloading_dynamic_library *)poVar6,what);
    __cxa_throw(what,&error_unloading_dynamic_library::typeinfo,
                error_unloading_dynamic_library::~error_unloading_dynamic_library);
  }
  std::
  map<boost::filesystem::path,void*,std::less<boost::filesystem::path>,std::allocator<std::pair<boost::filesystem::path_const,void*>>>
  ::erase_abi_cxx11_(in_stack_fffffffffffffc10,in_stack_fffffffffffffc18);
  return;
}

Assistant:

void DLManager::unload_library(const boost::filesystem::path &library_path) {
#ifdef BOOST_OS_UNIX
  auto it = DLMap::iterator(m_dl_map.find(library_path));
  // The library was not found
  if (it == m_dl_map.end()) {
    stringstream estream;
    estream << "ERROR : cannot trying to unload a shared library that was not previously loaded "
            << library_path << endl;
    estream << "\tDid you use a wrong name for the library to be unloaded?" << endl;
    throw library_not_loaded(estream.str());
  }
  // Close the library
  if (dlclose(it->second)) {
    auto error_message = dlerror();
    stringstream estream;
    estream << "ERROR : cannot unload shared library " << library_path << endl;
    estream << "\t" << error_message << endl;
    throw error_unloading_dynamic_library(estream.str());
  }
  m_dl_map.erase(it);
#endif
}